

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsTTDGetSnapTimeTopLevelEventMove
          (JsRuntimeHandle runtimeHandle,JsTTDMoveMode moveMode,uint32_t kthEvent,
          int64_t *targetEventTime,int64_t *targetStartSnapTime,int64_t *targetEndSnapTime)

{
  bool bVar1;
  JsrtRuntime *this;
  ThreadContext *this_00;
  int64 iVar2;
  ThreadContext *threadContext;
  JsrtRuntime *runtime;
  int64_t *targetEndSnapTime_local;
  int64_t *targetStartSnapTime_local;
  int64_t *targetEventTime_local;
  uint32_t kthEvent_local;
  JsTTDMoveMode moveMode_local;
  JsRuntimeHandle runtimeHandle_local;
  
  this = JsrtRuntime::FromHandle(runtimeHandle);
  this_00 = JsrtRuntime::GetThreadContext(this);
  *targetStartSnapTime = -1;
  if (targetEndSnapTime != (int64_t *)0x0) {
    *targetEndSnapTime = -1;
  }
  bVar1 = ThreadContext::IsRuntimeInTTDMode(this_00);
  if (bVar1) {
    if ((moveMode & JsTTDMoveFirstEvent) == JsTTDMoveFirstEvent) {
      iVar2 = TTD::EventLog::GetFirstEventTimeInLog(this_00->TTDLog);
      *targetEventTime = iVar2;
      if (*targetEventTime == -1) {
        return JsErrorCategoryUsage;
      }
    }
    else if ((moveMode & JsTTDMoveLastEvent) == JsTTDMoveLastEvent) {
      iVar2 = TTD::EventLog::GetLastEventTimeInLog(this_00->TTDLog);
      *targetEventTime = iVar2;
      if (*targetEventTime == -1) {
        return JsErrorCategoryUsage;
      }
    }
    else if ((moveMode & JsTTDMoveKthEvent) == JsTTDMoveKthEvent) {
      iVar2 = TTD::EventLog::GetKthEventTimeInLog(this_00->TTDLog,kthEvent);
      *targetEventTime = iVar2;
      if (*targetEventTime == -1) {
        return JsErrorCategoryUsage;
      }
    }
    iVar2 = TTD::EventLog::FindSnapTimeForEventTime
                      (this_00->TTDLog,*targetEventTime,targetEndSnapTime);
    *targetStartSnapTime = iVar2;
    return JsNoError;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDGetSnapTimeTopLevelEventMove(_In_ JsRuntimeHandle runtimeHandle,
   _In_ JsTTDMoveMode moveMode, _In_opt_ uint32_t kthEvent,
   _Inout_ int64_t* targetEventTime, _Out_ int64_t* targetStartSnapTime,
   _Out_opt_ int64_t* targetEndSnapTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtRuntime* runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext* threadContext = runtime->GetThreadContext();

    *targetStartSnapTime = -1;
    if(targetEndSnapTime != nullptr)
    {
        *targetEndSnapTime = -1;
    }

    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    //If we requested a move to a specific event then extract the event count and try to find it
    if((moveMode & JsTTDMoveMode::JsTTDMoveFirstEvent) == JsTTDMoveMode::JsTTDMoveFirstEvent)
    {
        *targetEventTime = threadContext->TTDLog->GetFirstEventTimeInLog();
        if(*targetEventTime == -1)
        {
            return JsErrorCategoryUsage;
        }
    }
    else if((moveMode & JsTTDMoveMode::JsTTDMoveLastEvent) == JsTTDMoveMode::JsTTDMoveLastEvent)
    {
        *targetEventTime = threadContext->TTDLog->GetLastEventTimeInLog();
        if(*targetEventTime == -1)
        {
            return JsErrorCategoryUsage;
        }
    }
    else if((moveMode & JsTTDMoveMode::JsTTDMoveKthEvent) == JsTTDMoveMode::JsTTDMoveKthEvent)
    {
        *targetEventTime = threadContext->TTDLog->GetKthEventTimeInLog(kthEvent);
        if(*targetEventTime == -1)
        {
            return JsErrorCategoryUsage;
        }
    }
    else
    {
        ;
    }

#ifdef __APPLE__
    //TODO: Explicit cast of ptr since compiler gets confused -- resolve in PAL later
    static_assert(sizeof(int64_t) == sizeof(int64), "int64_t and int64 size mis-match");
    *targetStartSnapTime = threadContext->TTDLog->FindSnapTimeForEventTime(*targetEventTime, (int64*)targetEndSnapTime);
#else
    *targetStartSnapTime = threadContext->TTDLog->FindSnapTimeForEventTime(*targetEventTime, targetEndSnapTime);
#endif

    return JsNoError;
#endif
}